

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O0

bool vkt::pipeline::isVertexFormatSscaled(VkFormat format)

{
  bool local_9;
  VkFormat format_local;
  
  switch(format) {
  case VK_FORMAT_R8_SSCALED:
  case VK_FORMAT_R8G8_SSCALED:
  case VK_FORMAT_R8G8B8_SSCALED:
  case VK_FORMAT_B8G8R8_SSCALED:
  case VK_FORMAT_R8G8B8A8_SSCALED:
  case VK_FORMAT_B8G8R8A8_SSCALED:
  case VK_FORMAT_A2R10G10B10_SSCALED_PACK32:
  case VK_FORMAT_A2B10G10R10_SSCALED_PACK32:
  case VK_FORMAT_R16_SSCALED:
  case VK_FORMAT_R16G16_SSCALED:
  case VK_FORMAT_R16G16B16_SSCALED:
  case VK_FORMAT_R16G16B16A16_SSCALED:
    local_9 = true;
    break;
  default:
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool isVertexFormatSscaled (VkFormat format)
{
	switch (format)
	{
		case VK_FORMAT_R8_SSCALED:
		case VK_FORMAT_R8G8_SSCALED:
		case VK_FORMAT_R16_SSCALED:
		case VK_FORMAT_R8G8B8_SSCALED:
		case VK_FORMAT_B8G8R8_SSCALED:
		case VK_FORMAT_R8G8B8A8_SSCALED:
		case VK_FORMAT_A2R10G10B10_SSCALED_PACK32:
		case VK_FORMAT_R16G16_SSCALED:
		case VK_FORMAT_B8G8R8A8_SSCALED:
		case VK_FORMAT_A2B10G10R10_SSCALED_PACK32:
		case VK_FORMAT_R16G16B16_SSCALED:
		case VK_FORMAT_R16G16B16A16_SSCALED:
			return true;

		default:
			break;
	}

	return false;

}